

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.cpp
# Opt level: O1

void __thiscall Vocabulary::Vocabulary(Vocabulary *this,string *file_path)

{
  int *piVar1;
  pointer pNVar2;
  pointer pNVar3;
  char cVar4;
  istream *piVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  long *plVar8;
  ostream *poVar9;
  string line;
  string token;
  fstream fs;
  stringstream ss;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined7 uStack_427;
  key_type local_418;
  Node local_3f8;
  long local_3c8 [66];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  (this->node2Id)._M_h._M_buckets = &(this->node2Id)._M_h._M_single_bucket;
  (this->node2Id)._M_h._M_bucket_count = 1;
  (this->node2Id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->node2Id)._M_h._M_element_count = 0;
  (this->node2Id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->node2Id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->node2Id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream(local_3c8,(string *)file_path,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"An error occurred during reading file.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  else {
    local_438 = &local_428;
    local_430 = 0;
    local_428 = 0;
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    local_418._M_string_length = 0;
    local_418.field_2._M_local_buf[0] = '\0';
    this->total_nodes = 0;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_3c8[0] + -0x18) +
                              (char)(istream *)local_3c8);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3c8,(string *)&local_438,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_438,_S_out|_S_in);
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b8,(string *)&local_418,' ');
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this,&local_418);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          pNVar2 = (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pNVar3 = (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,&local_418);
          *pmVar7 = (int)((ulong)((long)pNVar3 - (long)pNVar2) >> 4) * -0x55555555;
          Node::Node(&local_3f8,&local_418);
          std::vector<Node,_std::allocator<Node>_>::emplace_back<Node>
                    (&this->vocab_items,&local_3f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8.node._M_dataplus._M_p != &local_3f8.node.field_2) {
            operator_delete(local_3f8.node._M_dataplus._M_p,
                            local_3f8.node.field_2._M_allocated_capacity + 1);
          }
        }
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&local_418);
        piVar1 = &(this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start[*pmVar7].count;
        *piVar1 = *piVar1 + 1;
        this->total_nodes = this->total_nodes + 1;
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    std::fstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,
                      CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                               local_418.field_2._M_local_buf[0]) + 1);
    }
    if (local_438 != &local_428) {
      operator_delete(local_438,CONCAT71(uStack_427,local_428) + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--> The input file has been successfully read!",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    + The total number of nodes: ",0x21);
  plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->total_nodes);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    + The total number of distinct nodes: ",0x2a);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::fstream::~fstream(local_3c8);
  return;
}

Assistant:

Vocabulary::Vocabulary(string file_path) {

    fstream fs(file_path, fstream::in);
    if(fs.is_open()) {

        string line, token;

        total_nodes = 0;
        while( getline(fs, line) ) {
            stringstream ss(line);
            while( getline(ss, token, ' ') ) {

                // if the node was not added before
                auto token_search = node2Id.find(token);
                if (token_search == node2Id.end()) {

                    node2Id[token] = (int)vocab_items.size();
                    vocab_items.push_back(Node(token));
                }

                vocab_items[node2Id[token]].count++;
                total_nodes++;

            }

        }
        fs.close();

    } else {
        cout << "An error occurred during reading file." << endl;
    }

    cout << "--> The input file has been successfully read!" << endl;
    cout << "    + The total number of nodes: " << total_nodes << endl;
    cout << "    + The total number of distinct nodes: " << vocab_items.size() << endl;
}